

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O1

FilePath *
testing::internal::FilePath::MakeFileName
          (FilePath *__return_storage_ptr__,FilePath *directory,FilePath *base_name,int number,
          char *extension)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  undefined8 *puVar4;
  long *plVar5;
  _Alloc_hider _Var6;
  size_type *psVar7;
  _Alloc_hider _Var8;
  char cVar9;
  ulong uVar10;
  undefined8 uVar11;
  ulong *puVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string file;
  FilePath local_118;
  ulong *local_f8;
  long local_f0;
  ulong local_e8;
  long lStack_e0;
  int local_d4;
  ulong *local_d0;
  long local_c8;
  ulong local_c0 [2];
  long *local_b0;
  undefined8 local_a8;
  long local_a0;
  undefined8 uStack_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  long local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  string local_50;
  
  local_70 = &local_60;
  local_68 = 0;
  local_60 = 0;
  local_d4 = number;
  if (number == 0) {
    pcVar2 = (base_name->pathname_)._M_dataplus._M_p;
    local_f8 = &local_e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,pcVar2,pcVar2 + (base_name->pathname_)._M_string_length);
    std::__cxx11::string::append((char *)&local_f8);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
    paVar1 = &local_118.pathname_.field_2;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_118.pathname_.field_2._M_allocated_capacity = *psVar7;
      local_118.pathname_.field_2._8_8_ = plVar5[3];
      local_118.pathname_._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_118.pathname_.field_2._M_allocated_capacity = *psVar7;
      local_118.pathname_._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_118.pathname_._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.pathname_._M_dataplus._M_p != paVar1) {
      operator_delete(local_118.pathname_._M_dataplus._M_p,
                      local_118.pathname_.field_2._M_allocated_capacity + 1);
    }
    local_c0[0] = local_e8;
    puVar12 = local_f8;
    if (local_f8 == &local_e8) goto LAB_00125611;
  }
  else {
    pcVar2 = (base_name->pathname_)._M_dataplus._M_p;
    local_d0 = local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar2,pcVar2 + (base_name->pathname_)._M_string_length);
    std::__cxx11::string::append((char *)&local_d0);
    StreamableToString<int>(&local_50,&local_d4);
    uVar10 = 0xf;
    if (local_d0 != local_c0) {
      uVar10 = local_c0[0];
    }
    if (uVar10 < local_50._M_string_length + local_c8) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        uVar11 = local_50.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_50._M_string_length + local_c8) goto LAB_001253a3;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_d0);
    }
    else {
LAB_001253a3:
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_50._M_dataplus._M_p);
    }
    local_b0 = &local_a0;
    plVar5 = puVar4 + 2;
    if ((long *)*puVar4 == plVar5) {
      local_a0 = *plVar5;
      uStack_98 = puVar4[3];
    }
    else {
      local_a0 = *plVar5;
      local_b0 = (long *)*puVar4;
    }
    local_a8 = puVar4[1];
    *puVar4 = plVar5;
    puVar4[1] = 0;
    *(undefined1 *)plVar5 = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
    puVar12 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar12) {
      local_e8 = *puVar12;
      lStack_e0 = plVar5[3];
      local_f8 = &local_e8;
    }
    else {
      local_e8 = *puVar12;
      local_f8 = (ulong *)*plVar5;
    }
    local_f0 = plVar5[1];
    *plVar5 = (long)puVar12;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
    paVar1 = &local_118.pathname_.field_2;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_118.pathname_.field_2._M_allocated_capacity = *psVar7;
      local_118.pathname_.field_2._8_8_ = plVar5[3];
      local_118.pathname_._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_118.pathname_.field_2._M_allocated_capacity = *psVar7;
      local_118.pathname_._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_118.pathname_._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.pathname_._M_dataplus._M_p != paVar1) {
      operator_delete(local_118.pathname_._M_dataplus._M_p,
                      local_118.pathname_.field_2._M_allocated_capacity + 1);
    }
    if (local_f8 != &local_e8) {
      operator_delete(local_f8,local_e8 + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    puVar12 = local_d0;
    if (local_d0 == local_c0) goto LAB_00125611;
  }
  operator_delete(puVar12,local_c0[0] + 1);
LAB_00125611:
  local_90 = &local_80;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_70,local_70 + local_68);
  lVar3 = local_88;
  paVar1 = &local_118.pathname_.field_2;
  if (local_90 == &local_80) {
    local_118.pathname_.field_2._8_8_ = local_80._8_8_;
    local_118.pathname_._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_118.pathname_._M_dataplus._M_p = (pointer)local_90;
  }
  local_118.pathname_.field_2._M_allocated_capacity._1_7_ = local_80._M_allocated_capacity._1_7_;
  local_118.pathname_.field_2._M_local_buf[0] = local_80._M_local_buf[0];
  local_88 = 0;
  local_80._M_local_buf[0] = '\0';
  _Var6._M_p = local_118.pathname_._M_dataplus._M_p;
  _Var8._M_p = local_118.pathname_._M_dataplus._M_p;
  if (lVar3 != 0) {
    do {
      cVar9 = *_Var8._M_p;
      if (((cVar9 != '/') || (cVar9 = '/', _Var6._M_p == local_118.pathname_._M_dataplus._M_p)) ||
         (_Var6._M_p[-1] != '/')) {
        *_Var6._M_p = cVar9;
        _Var6._M_p = _Var6._M_p + 1;
      }
      _Var8._M_p = _Var8._M_p + 1;
    } while (_Var8._M_p != local_118.pathname_._M_dataplus._M_p + lVar3);
  }
  local_118.pathname_._M_string_length =
       (long)_Var6._M_p - (long)local_118.pathname_._M_dataplus._M_p;
  *_Var6._M_p = '\0';
  local_90 = &local_80;
  ConcatPaths(__return_storage_ptr__,directory,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.pathname_._M_dataplus._M_p != paVar1) {
    operator_delete(local_118.pathname_._M_dataplus._M_p,
                    local_118.pathname_.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(local_80._M_allocated_capacity._1_7_,local_80._M_local_buf[0])
                             + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::MakeFileName(const FilePath& directory,
                                const FilePath& base_name, int number,
                                const char* extension) {
  std::string file;
  if (number == 0) {
    file = base_name.string() + "." + extension;
  } else {
    file =
        base_name.string() + "_" + StreamableToString(number) + "." + extension;
  }
  return ConcatPaths(directory, FilePath(file));
}